

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseXOROperator,bool,false,false>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  uhugeint_t local_78;
  uhugeint_t local_68;
  idx_t local_50;
  ulong local_48;
  ValidityMask *local_40;
  ulong local_38;
  
  local_40 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar4 = 0;
      do {
        puVar1 = (uint64_t *)((long)&ldata->lower + lVar4);
        local_78.lower = *puVar1;
        local_78.upper = puVar1[1];
        puVar1 = (uint64_t *)((long)&rdata->lower + lVar4);
        local_68.lower = *puVar1;
        local_68.upper = puVar1[1];
        auVar8 = duckdb::uhugeint_t::operator^(&local_78,&local_68);
        *(long *)((long)&result_data->lower + lVar4) = auVar8._0_8_;
        *(long *)((long)&result_data->upper + lVar4) = auVar8._8_8_;
        lVar4 = lVar4 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_48 = count + 0x3f >> 6;
    local_38 = 0;
    uVar5 = 0;
    local_50 = count;
    do {
      puVar2 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar3 = 0xffffffffffffffff;
      }
      else {
        uVar3 = puVar2[local_38];
      }
      uVar7 = uVar5 + 0x40;
      if (count <= uVar5 + 0x40) {
        uVar7 = count;
      }
      uVar6 = uVar7;
      if (uVar3 != 0) {
        uVar6 = uVar5;
        if (uVar3 == 0xffffffffffffffff) {
          if (uVar5 < uVar7) {
            lVar4 = uVar5 << 4;
            do {
              puVar1 = (uint64_t *)((long)&ldata->lower + lVar4);
              local_78.lower = *puVar1;
              local_78.upper = puVar1[1];
              puVar1 = (uint64_t *)((long)&rdata->lower + lVar4);
              local_68.lower = *puVar1;
              local_68.upper = puVar1[1];
              auVar8 = duckdb::uhugeint_t::operator^(&local_78,&local_68);
              *(long *)((long)&result_data->lower + lVar4) = auVar8._0_8_;
              *(long *)((long)&result_data->upper + lVar4) = auVar8._8_8_;
              uVar5 = uVar5 + 1;
              lVar4 = lVar4 + 0x10;
              uVar6 = uVar5;
            } while (uVar7 != uVar5);
          }
        }
        else {
          count = local_50;
          if (uVar5 < uVar7) {
            lVar4 = uVar5 << 4;
            uVar6 = 0;
            do {
              if ((uVar3 >> (uVar6 & 0x3f) & 1) != 0) {
                puVar1 = (uint64_t *)((long)&ldata->lower + lVar4);
                local_78.lower = *puVar1;
                local_78.upper = puVar1[1];
                puVar1 = (uint64_t *)((long)&rdata->lower + lVar4);
                local_68.lower = *puVar1;
                local_68.upper = puVar1[1];
                auVar8 = duckdb::uhugeint_t::operator^(&local_78,&local_68);
                *(long *)((long)&result_data->lower + lVar4) = auVar8._0_8_;
                *(long *)((long)&result_data->upper + lVar4) = auVar8._8_8_;
              }
              uVar6 = uVar6 + 1;
              lVar4 = lVar4 + 0x10;
            } while ((uVar5 - uVar7) + uVar6 != 0);
            uVar6 = uVar5 + uVar6;
            count = local_50;
          }
        }
      }
      local_38 = local_38 + 1;
      uVar5 = uVar6;
    } while (local_38 != local_48);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}